

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::updateTest(SPxSolverBase<double> *this)

{
  int i;
  Status stat;
  UpdateVector<double> *pUVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  SSVectorBase<double>::setup(&this->thePvec->thedelta);
  pUVar1 = this->thePvec;
  dVar3 = leavetol(this);
  (this->updateViolsCo).super_IdxSet.num = 0;
  dVar3 = -dVar3;
  for (uVar2 = (ulong)(uint)(pUVar1->thedelta).super_IdxSet.num; 0 < (int)uVar2; uVar2 = uVar2 - 1)
  {
    i = (pUVar1->thedelta).super_IdxSet.idx[uVar2 - 1];
    stat = ((this->super_SPxBasisBase<double>).thedesc.stat)->data[i];
    if (this->theRep * stat < 1) {
      if ((this->m_pricingViolCoUpToDate == true) &&
         (dVar4 = (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[i], dVar4 < dVar3)) {
        this->m_pricingViolCo = dVar4 + this->m_pricingViolCo;
      }
      dVar4 = test(this,i,stat);
      (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] = dVar4;
      if (this->sparsePricingEnterCo == true) {
        if (dVar3 <= dVar4) {
          (this->isInfeasibleCo).data[i] = 0;
        }
        else {
          this->m_pricingViolCo = this->m_pricingViolCo - dVar4;
          if ((this->isInfeasibleCo).data[i] == 0) {
            DIdxSet::addIdx(&this->infeasibilitiesCo,i);
            (this->isInfeasibleCo).data[i] = 1;
          }
          if (this->hyperPricingEnter != false) {
            DIdxSet::addIdx(&this->updateViolsCo,i);
          }
        }
      }
      else if (dVar4 < dVar3) {
        this->m_pricingViolCo = this->m_pricingViolCo - dVar4;
      }
    }
    else {
      (this->isInfeasibleCo).data[i] = 0;
      (this->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[i] = 0.0;
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateTest()
{
   thePvec->delta().setup();

   const IdxSet& idx = thePvec->idx();
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   R pricingTol = leavetol();

   int i;
   updateViolsCo.clear();

   for(i = idx.size() - 1; i >= 0; --i)
   {
      int j = idx.index(i);
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(j);

      if(!isBasic(stat))
      {
         if(m_pricingViolCoUpToDate && theTest[j] < -pricingTol)
            m_pricingViolCo += theTest[j];

         theTest[j] = test(j, stat);

         if(sparsePricingEnterCo)
         {
            if(theTest[j] < -pricingTol)
            {
               assert(remainingRoundsEnterCo == 0);
               m_pricingViolCo -= theTest[j];

               if(isInfeasibleCo[j] == SPxPricer<R>::NOT_VIOLATED)
               {
                  infeasibilitiesCo.addIdx(j);
                  isInfeasibleCo[j] = SPxPricer<R>::VIOLATED;
               }

               if(hyperPricingEnter)
                  updateViolsCo.addIdx(j);
            }
            else
            {
               isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
            }
         }
         else if(theTest[j] < -pricingTol)
            m_pricingViolCo -= theTest[j];
      }
      else
      {
         isInfeasibleCo[j] = SPxPricer<R>::NOT_VIOLATED;
         theTest[j] = 0;
      }
   }
}